

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuFloatFormat.cpp
# Opt level: O3

double __thiscall
tcu::FloatFormat::roundOut(FloatFormat *this,double d,bool upward,bool roundUnderOverflow)

{
  undefined3 in_register_00000011;
  int exp;
  int local_24;
  double local_20;
  
  local_24 = 0;
  local_20 = d;
  deFractExp(d,&local_24);
  if (((CONCAT31(in_register_00000011,roundUnderOverflow) == 0) || (0.0 <= local_20 == upward)) ||
     (local_24 <= this->m_maxExp)) {
    local_20 = round(this,local_20);
  }
  else {
    if (!NAN(local_20)) {
      local_20 = (double)(int)((uint)(0.0 < local_20) - (uint)(local_20 < 0.0));
    }
    local_20 = local_20 * this->m_maxValue;
  }
  return local_20;
}

Assistant:

double FloatFormat::roundOut (double d, bool upward, bool roundUnderOverflow) const
{
	int	exp	= 0;
	deFractExp(d, &exp);

	if (roundUnderOverflow && exp > m_maxExp && (upward == (d < 0.0)))
		return deSign(d) * getMaxValue();
	else
		return round(d, upward);
}